

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O1

SnapArrayInfo<double> *
TTD::NSSnapObjects::ParseAddtlInfo_SnapArrayInfoCore<double>
          (FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  int32 iVar4;
  uint32 uVar5;
  SnapArrayInfoBlock<double> *pSVar6;
  uchar *puVar7;
  double *pdVar8;
  SnapArrayInfoBlock<double> *pSVar9;
  SnapArrayInfo<double> *pSVar10;
  SnapArrayInfoBlock<double> *pSVar11;
  uint uVar12;
  SnapArrayInfoBlock<double> *pSVar13;
  
  uVar1 = FileReader::ReadLengthValue(reader,true);
  uVar2 = FileReader::ReadLengthValue(reader,true);
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  uVar5 = 0;
  if (uVar2 == 0) {
    pSVar9 = (SnapArrayInfoBlock<double> *)0x0;
  }
  else {
    pSVar11 = (SnapArrayInfoBlock<double> *)0x0;
    pSVar13 = (SnapArrayInfoBlock<double> *)0x0;
    do {
      (*reader->_vptr_FileReader[6])(reader,(ulong)(uVar5 != 0));
      pSVar6 = (SnapArrayInfoBlock<double> *)
               SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
      uVar3 = FileReader::ReadUInt32(reader,index,false);
      pSVar6->FirstIndex = uVar3;
      uVar3 = FileReader::ReadUInt32(reader,offset,true);
      pSVar6->LastIndex = uVar3;
      puVar7 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>
                         (alloc,(ulong)(uVar3 - pSVar6->FirstIndex));
      pSVar6->ArrayValidTags = puVar7;
      pdVar8 = SlabAllocatorBase<0>::SlabAllocateArray<double>
                         (alloc,(ulong)(pSVar6->LastIndex - pSVar6->FirstIndex));
      pSVar6->ArrayRangeContents = pdVar8;
      pSVar6->Next = (SnapArrayInfoBlock<double> *)0x0;
      if (pSVar11 != (SnapArrayInfoBlock<double> *)0x0) {
        pSVar11->Next = pSVar6;
      }
      pSVar9 = pSVar6;
      if (pSVar13 != (SnapArrayInfoBlock<double> *)0x0) {
        pSVar9 = pSVar13;
      }
      FileReader::ReadSequenceStart_WDefaultKey(reader,true);
      for (uVar3 = pSVar6->FirstIndex; uVar3 < pSVar6->LastIndex; uVar3 = uVar3 + 1) {
        uVar12 = uVar3 - pSVar6->FirstIndex;
        (*reader->_vptr_FileReader[6])(reader,(ulong)(uVar12 != 0));
        iVar4 = FileReader::ReadInt32(reader,isValid,false);
        pSVar6->ArrayValidTags[uVar12] = (byte)iVar4;
        if (pSVar6->ArrayValidTags[uVar12] != '\0') {
          SnapArrayInfo_ParseValue(pSVar6->ArrayRangeContents + uVar12,reader,alloc);
        }
        (*reader->_vptr_FileReader[7])(reader);
      }
      (*reader->_vptr_FileReader[5])(reader);
      (*reader->_vptr_FileReader[7])(reader);
      uVar5 = uVar5 + 1;
      pSVar11 = pSVar6;
      pSVar13 = pSVar9;
    } while (uVar5 != uVar2);
  }
  (*reader->_vptr_FileReader[5])(reader);
  pSVar10 = (SnapArrayInfo<double> *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  pSVar10->Length = uVar1;
  pSVar10->Data = pSVar9;
  return pSVar10;
}

Assistant:

SnapArrayInfo<T>* ParseAddtlInfo_SnapArrayInfoCore(FileReader* reader, SlabAllocator& alloc)
        {
            uint32 alength = reader->ReadLengthValue(true);

            SnapArrayInfoBlock<T>* arrayInfo = nullptr;
            SnapArrayInfoBlock<T>* curr = nullptr;

            uint32 blockCount = reader->ReadLengthValue(true);
            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 k = 0; k < blockCount; ++k)
            {
                reader->ReadRecordStart(k != 0);

                SnapArrayInfoBlock<T>* tmp = alloc.SlabAllocateStruct< SnapArrayInfoBlock<T> >();
                tmp->FirstIndex = reader->ReadUInt32(NSTokens::Key::index);
                tmp->LastIndex = reader->ReadUInt32(NSTokens::Key::offset, true);

                tmp->ArrayValidTags = alloc.SlabAllocateArray<byte>(tmp->LastIndex - tmp->FirstIndex);
                tmp->ArrayRangeContents = alloc.SlabAllocateArray<T>(tmp->LastIndex - tmp->FirstIndex);
                tmp->Next = nullptr;

                if(curr != nullptr)
                {
                    curr->Next = tmp;
                }
                curr = tmp;
                TTDAssert(curr != nullptr, "Sanity assert failed.");

                if(arrayInfo == nullptr)
                {
                    arrayInfo = curr;
                }

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = curr->FirstIndex; i < curr->LastIndex; ++i)
                {
                    uint32 j = (i - curr->FirstIndex);
                    reader->ReadRecordStart(j != 0);

                    curr->ArrayValidTags[j] = (byte)reader->ReadInt32(NSTokens::Key::isValid);
                    if(curr->ArrayValidTags[j])
                    {
                        SnapArrayInfo_ParseValue(curr->ArrayRangeContents + j, reader, alloc);
                    }
                    reader->ReadRecordEnd();
                }
                reader->ReadSequenceEnd();
                reader->ReadRecordEnd();
            }
            reader->ReadSequenceEnd();

            SnapArrayInfo<T>* res = alloc.SlabAllocateStruct< SnapArrayInfo<T> >();
            res->Length = alength;
            res->Data = arrayInfo;

            return res;
        }